

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O3

void pnga_msg_pgroup_sync(Integer grp_id)

{
  int p_grp;
  
  if (0 < (int)(uint)grp_id) {
    armci_msg_group_barrier(&PGRP_LIST[(uint)grp_id & 0x7fffffff].group);
    return;
  }
  armci_msg_barrier();
  return;
}

Assistant:

void pnga_msg_pgroup_sync(Integer grp_id)
{
    int p_grp = (int)(grp_id);
    if(p_grp>0) {
#     ifdef MSG_COMMS_MPI       
        armci_msg_group_barrier(&(PGRP_LIST[p_grp].group));
#     else
        pnga_error("ga_msg_pgroup_sync not implemented",0);
#     endif
    }
    else {
#     if defined(MSG_COMMS_MPI)
       armci_msg_barrier();
#     else
       tcg_synch(GA_TYPE_SYN);
#    endif
    }
}